

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_writer_reader_phaser.c
# Opt level: O1

int hdr_writer_reader_phaser_init(hdr_writer_reader_phaser *p)

{
  int iVar1;
  hdr_mutex *mutex;
  
  if (p == (hdr_writer_reader_phaser *)0x0) {
    return 0x16;
  }
  p->start_epoch = 0;
  p->even_end_epoch = 0;
  p->odd_end_epoch = -0x8000000000000000;
  mutex = hdr_mutex_alloc();
  p->reader_mutex = mutex;
  if (mutex != (hdr_mutex *)0x0) {
    iVar1 = hdr_mutex_init(mutex);
    return iVar1;
  }
  return 0xc;
}

Assistant:

int hdr_writer_reader_phaser_init(struct hdr_writer_reader_phaser* p)
{
    int rc;
    if (NULL == p)
    {
        return EINVAL;
    }

    p->start_epoch = 0;
    p->even_end_epoch = 0;
    p->odd_end_epoch = INT64_MIN;
    p->reader_mutex = hdr_mutex_alloc();

    if (!p->reader_mutex)
    {
        return ENOMEM;
    }

    rc = hdr_mutex_init(p->reader_mutex);
    if (0 != rc)
    {
        return rc;
    }

    /* TODO: Should I fence here. */

    return 0;
}